

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

int __thiscall Pathie::Path::rename(Path *this,char *__old,char *__new)

{
  int iVar1;
  ErrnoError *this_00;
  int *piVar2;
  string newname_nstr;
  string nstr;
  
  utf8_to_filename(&nstr,&this->m_path);
  utf8_to_filename(&newname_nstr,(string *)__old);
  iVar1 = ::rename(nstr._M_dataplus._M_p,newname_nstr._M_dataplus._M_p);
  if (iVar1 == 0) {
    std::__cxx11::string::_M_dispose();
    iVar1 = std::__cxx11::string::_M_dispose();
    return iVar1;
  }
  this_00 = (ErrnoError *)__cxa_allocate_exception(0x30);
  piVar2 = __errno_location();
  ErrnoError::ErrnoError(this_00,*piVar2);
  __cxa_throw(this_00,&ErrnoError::typeinfo,GlobError::~GlobError);
}

Assistant:

void Path::rename(Path& newname) const
{
#if defined(_PATHIE_UNIX)
  std::string nstr = native();
  std::string newname_nstr = newname.native();

  if (::rename(nstr.c_str(), newname_nstr.c_str()) != 0)
    throw Pathie::ErrnoError(errno);
#elif defined(_WIN32)
  std::wstring utf16_oldname = utf8_to_utf16(m_path);
  std::wstring utf16_newname = utf8_to_utf16(newname.m_path);

  if (_wrename(utf16_oldname.c_str(), utf16_newname.c_str()) != 0)
    throw Pathie::ErrnoError(errno);
#else
#error Unsupported system.
#endif
}